

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O3

void writeDeepScanLine(DeepScanLineOutputPart *out,DeepFrameBuffer *buf,
                      vector<double,_std::allocator<double>_> *perf)

{
  iterator __position;
  long lVar1;
  long lVar2;
  double local_28;
  
  Imf_3_4::DeepScanLineOutputPart::setFrameBuffer((DeepFrameBuffer *)out);
  Imf_3_4::DeepScanLineOutputPart::header();
  Imf_3_4::Header::dataWindow();
  lVar1 = std::chrono::_V2::steady_clock::now();
  Imf_3_4::DeepScanLineOutputPart::writePixels((int)out);
  if (perf != (vector<double,_std::allocator<double>_> *)0x0) {
    lVar2 = std::chrono::_V2::steady_clock::now();
    local_28 = (double)(lVar2 - lVar1) / 1000000000.0;
    __position._M_current =
         (perf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
         ._M_finish;
    if (__position._M_current ==
        (perf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (perf,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      (perf->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void
writeDeepScanLine (
    DeepScanLineOutputPart& out, DeepFrameBuffer& buf, vector<double>* perf)
{
    out.setFrameBuffer (buf);
    Box2i dw = out.header ().dataWindow ();

    steady_clock::time_point start = steady_clock::now ();
    out.writePixels (dw.max.y - dw.min.y + 1);
    if (perf)
    {
        steady_clock::time_point end = steady_clock::now ();
        perf->push_back (timing (start, end));
    }
}